

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_update_all_string_key(planck_unit_test_t *tc)

{
  uint uVar1;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  key[8] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  bhdct_setup_string_key(tc,&handler,&dict,ion_fill_edge_cases);
  for (uVar1 = 0; uVar1 != 10; uVar1 = uVar1 + 1) {
    sprintf(key,"k%d",(ulong)uVar1);
    local_ac = 0xfffffac7;
    bhdct_update(tc,&dict,key,&local_ac,'\0',1,'\x01');
  }
  for (uVar1 = 0x32; uVar1 < 100; uVar1 = uVar1 + 2) {
    sprintf(key,"k%d",(ulong)uVar1);
    local_b0 = 0xfffffac7;
    bhdct_update(tc,&dict,key,&local_b0,'\0',1,'\x01');
  }
  for (uVar1 = 500; uVar1 < 1000; uVar1 = uVar1 + 5) {
    sprintf(key,"k%d",(ulong)uVar1);
    local_b4 = 0xfffffac7;
    bhdct_update(tc,&dict,key,&local_b4,'\0',1,'\x01');
  }
  for (uVar1 = 0xffffff9c; (int)uVar1 < -0x32; uVar1 = uVar1 + 2) {
    sprintf(key,"k%d",(ulong)uVar1);
    local_b8 = 0xfffffac7;
    bhdct_update(tc,&dict,key,&local_b8,'\0',1,'\x01');
  }
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_update_all_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_update(tc, &dict, key, IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_update(tc, &dict, key, IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_HIGH_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_update(tc, &dict, key, IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_EDGE_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_update(tc, &dict, key, IONIZE(-1337, int), err_ok, 1, boolean_true);
	}

	bhdct_takedown(tc, &dict);
}